

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

uint __thiscall
ON_SubDVertex::SharpEdgeCount
          (ON_SubDVertex *this,bool bCountCreasesAsSharp,bool bEndCheck,ON_Interval *sharpness_range
          )

{
  bool bVar1;
  ON_SubDEdge *this_00;
  double local_60;
  double s;
  ON_SubDEdge *e;
  double dStack_38;
  unsigned_short vei;
  double maxs;
  double mins;
  uint sharp_edge_count;
  ON_Interval *sharpness_range_local;
  bool bEndCheck_local;
  bool bCountCreasesAsSharp_local;
  ON_SubDVertex *this_local;
  
  mins._4_4_ = 0;
  maxs = 0.0;
  dStack_38 = 0.0;
  if (this->m_edges != (ON_SubDEdgePtr *)0x0) {
    for (e._6_2_ = 0; e._6_2_ < this->m_edge_count; e._6_2_ = e._6_2_ + 1) {
      this_00 = (ON_SubDEdge *)(this->m_edges[e._6_2_].m_ptr & 0xfffffffffffffff8);
      if (((this_00 != (ON_SubDEdge *)0x0) && (this_00->m_face_count == 2)) &&
         ((bVar1 = ON_SubDEdge::IsSharp(this_00), bVar1 ||
          ((bCountCreasesAsSharp && (bVar1 = ON_SubDEdge::IsCrease(this_00), bVar1)))))) {
        bVar1 = ON_SubDEdge::IsCrease(this_00);
        if (bVar1) {
          local_60 = 5.0;
        }
        else {
          local_60 = ON_SubDEdge::EndSharpness(this_00,this);
        }
        if ((!bEndCheck) || (0.0 < local_60)) {
          if (mins._4_4_ == 0) {
            maxs = local_60;
            dStack_38 = local_60;
          }
          else if (maxs <= local_60) {
            if (dStack_38 < local_60) {
              dStack_38 = local_60;
            }
          }
          else {
            maxs = local_60;
          }
          mins._4_4_ = mins._4_4_ + 1;
        }
      }
    }
  }
  ON_Interval::Set(sharpness_range,maxs,dStack_38);
  return mins._4_4_;
}

Assistant:

unsigned int ON_SubDVertex::SharpEdgeCount(
  bool bCountCreasesAsSharp,
  bool bEndCheck,
  ON_Interval& sharpness_range
) const
{
  unsigned int sharp_edge_count = 0;
  double mins = 0.0;
  double maxs = 0.0;
  if (nullptr != m_edges)
  {
    for (unsigned short vei = 0; vei < m_edge_count; ++vei)
    {
      const ON_SubDEdge* e = ON_SUBD_EDGE_POINTER(m_edges[vei].m_ptr);
      if (nullptr == e || 2 != e->m_face_count)
        continue;
      if (false == e->IsSharp())
      {
        if (false == bCountCreasesAsSharp || false == e->IsCrease())
          continue;
      }
      const double s = e->IsCrease() ? ON_SubDEdgeSharpness::CreaseValue : e->EndSharpness(this);
      if (false == bEndCheck || s > 0.0)
      {
        if (0 == sharp_edge_count)
        {
          mins = s;
          maxs = s;
        }
        else if (s < mins)
          mins = s;
        else if (s > maxs)
          maxs = s;
        ++sharp_edge_count;
      }
    }
  }
  sharpness_range.Set(mins, maxs);
  return sharp_edge_count;
}